

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O0

int first_marker(void)

{
  int iVar1;
  int iVar2;
  int c2;
  int c1;
  
  iVar1 = getc((FILE *)infile);
  iVar2 = getc((FILE *)infile);
  if ((iVar1 == 0xff) && (iVar2 == 0xd8)) {
    return 0xd8;
  }
  fprintf(_stderr,"%s\n","Not a JPEG file");
  exit(1);
}

Assistant:

static int
first_marker(void)
{
  int c1, c2;

  c1 = NEXTBYTE();
  c2 = NEXTBYTE();
  if (c1 != 0xFF || c2 != M_SOI)
    ERREXIT("Not a JPEG file");
  return c2;
}